

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Opnd * Lowerer::GetMissingItemOpndForAssignment(IRType type,Func *func)

{
  ushort uVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  byte bVar7;
  uint sourceContextId;
  uint functionId;
  Opnd *pOVar8;
  JITTimeFunctionBody *this;
  FunctionJITTimeInfo *this_00;
  undefined7 extraout_var;
  LabelInstr *helperLabel;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  AddrOpnd *pAVar11;
  IndirOpnd *pIVar12;
  undefined8 extraout_RAX;
  undefined7 uVar17;
  RegOpnd *pRVar13;
  IntConstOpnd *pIVar14;
  intptr_t iVar15;
  MemRefOpnd *pMVar16;
  intptr_t in_RCX;
  ArrayCallSiteInfo *arrayInfo;
  ArrayCallSiteInfo *arrayInfo_00;
  ArrayCallSiteInfo *arrayInfo_01;
  ArrayCallSiteInfo *arrayInfo_02;
  LabelInstr *unaff_RBX;
  bool unaff_BPL;
  Func *instr;
  undefined7 in_register_00000039;
  Lowerer *this_01;
  intptr_t in_R8;
  uint in_R9D;
  uint uVar18;
  int iVar19;
  uint uStack_50;
  bool bStack_49;
  Func *pFStack_48;
  
  this_01 = (Lowerer *)CONCAT71(in_register_00000039,type);
  iVar19 = (int)this_01;
  if (iVar19 == 0x17) {
LAB_005c314e:
    pOVar8 = GetMissingItemOpnd(type,func);
    return pOVar8;
  }
  if (iVar19 == 10) {
    iVar15 = ThreadContextInfo::GetNativeFloatArrayMissingItemAddr(func->m_threadContextInfo);
    pMVar16 = IR::MemRefOpnd::New(iVar15,TyFloat64,func,AddrOpndKindDynamicMisc);
    return &pMVar16->super_Opnd;
  }
  if (iVar19 == 3) goto LAB_005c314e;
  instr = func;
  GetMissingItemOpndForAssignment();
  pFStack_48 = func;
  this = JITTimeWorkItem::GetJITFunctionBody(this_01->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this);
  this_00 = JITTimeWorkItem::GetJITTimeInfo(this_01->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,ArrayCtorFastPathPhase,sourceContextId,functionId);
  uVar17 = extraout_var;
  if (bVar4) goto LAB_005c341c;
  pFVar2 = this_01->m_func;
  helperLabel = IR::LabelInstr::New(Label,pFVar2,true);
  bStack_49 = false;
  pRVar10 = (RegOpnd *)instr->pinnedTypeRefs;
  uStack_50 = in_R9D;
  OVar5 = IR::Opnd::GetKind((Opnd *)pRVar10);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_005c366e;
    *puVar9 = 0;
  }
  if (*(char *)((long)&instr->constructorCaches + 1) != '\x04') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
    if (!bVar6) {
LAB_005c366e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  if (arrayInfo_00 == (ArrayCallSiteInfo *)0x0) {
    arrayInfo = (ArrayCallSiteInfo *)0x0;
LAB_005c3379:
    pRVar10 = GenerateArrayAllocHelper<Js::JavascriptArray>
                        (this_01,(Instr *)instr,&uStack_50,arrayInfo,&bStack_49,true,unaff_BPL);
    if (uStack_50 != 0) {
      uVar18 = 0;
      iVar19 = 0x18;
      do {
        pAVar11 = IR::AddrOpnd::New(&DAT_40002fff80002,AddrOpndKindConstantAddress,this_01->m_func,
                                    true,(Var)0x0);
        pIVar12 = IR::IndirOpnd::New(pRVar10,iVar19,(pAVar11->super_Opnd).m_type,this_01->m_func,
                                     false);
        InsertMove(&pIVar12->super_Opnd,&pAVar11->super_Opnd,(Instr *)instr,true);
        uVar18 = uVar18 + 1;
        iVar19 = iVar19 + 8;
      } while (uVar18 < uStack_50);
    }
  }
  else {
    uVar1 = *(ushort *)&instr->propertyGuardsByPropertyId;
    bVar7 = (arrayInfo_00->field_0).bits;
    if ((bVar7 & 1) == 0) {
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase);
      if (bVar6) {
        bVar7 = (arrayInfo_00->field_0).bits;
        goto LAB_005c3328;
      }
      GenerateArrayInfoIsNativeIntArrayTest(this_01,(Instr *)instr,arrayInfo_01,in_RCX,helperLabel);
      pRVar13 = GenerateArrayAllocHelper<Js::JavascriptNativeIntArray>
                          (this_01,(Instr *)instr,&uStack_50,arrayInfo_00,&bStack_49,true,unaff_BPL)
      ;
      pIVar14 = IR::IntConstOpnd::New((ulong)uVar1,TyUint16,pFVar2,true);
      uVar18 = 0;
      pIVar12 = IR::IndirOpnd::New(pRVar10,0x1a,(pIVar14->super_Opnd).m_type,this_01->m_func,false);
      InsertMove(&pIVar12->super_Opnd,&pIVar14->super_Opnd,(Instr *)instr,true);
      pAVar11 = IR::AddrOpnd::New(in_R8,AddrOpndKindDynamicFunctionBodyWeakRef,this_01->m_func,false
                                  ,(Var)0x0);
      pIVar12 = IR::IndirOpnd::New(pRVar10,0x38,(pAVar11->super_Opnd).m_type,this_01->m_func,false);
      InsertMove(&pIVar12->super_Opnd,&pAVar11->super_Opnd,(Instr *)instr,true);
      if (uStack_50 != 0) {
        iVar19 = 0x18;
        do {
          GenerateMemInit(this_01,pRVar13,iVar19,-0x7fffe,(Instr *)instr,bStack_49);
          uVar18 = uVar18 + 1;
          iVar19 = iVar19 + 4;
        } while (uVar18 < uStack_50);
      }
    }
    else {
LAB_005c3328:
      arrayInfo = arrayInfo_00;
      if (((bVar7 & 2) != 0) ||
         (bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase), bVar6))
      goto LAB_005c3379;
      GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
                (this_01,(Instr *)instr,arrayInfo_02,in_RCX,helperLabel);
      pRVar13 = GenerateArrayAllocHelper<Js::JavascriptNativeFloatArray>
                          (this_01,(Instr *)instr,&uStack_50,arrayInfo_00,&bStack_49,true,unaff_BPL)
      ;
      pIVar14 = IR::IntConstOpnd::New((ulong)uVar1,TyUint16,pFVar2,true);
      uVar18 = 0;
      pIVar12 = IR::IndirOpnd::New(pRVar10,0x1a,(pIVar14->super_Opnd).m_type,this_01->m_func,false);
      InsertMove(&pIVar12->super_Opnd,&pIVar14->super_Opnd,(Instr *)instr,true);
      pAVar11 = IR::AddrOpnd::New(in_R8,AddrOpndKindDynamicFunctionBodyWeakRef,this_01->m_func,false
                                  ,(Var)0x0);
      pIVar12 = IR::IndirOpnd::New(pRVar10,0x38,(pAVar11->super_Opnd).m_type,this_01->m_func,false);
      InsertMove(&pIVar12->super_Opnd,&pAVar11->super_Opnd,(Instr *)instr,true);
      if (uStack_50 != 0) {
        iVar19 = 0x18;
        do {
          pFVar2 = this_01->m_func;
          iVar15 = ThreadContextInfo::GetNativeFloatArrayMissingItemAddr
                             (pFVar2->m_threadContextInfo);
          pMVar16 = IR::MemRefOpnd::New(iVar15,TyFloat64,pFVar2,AddrOpndKindDynamicMisc);
          pIVar12 = IR::IndirOpnd::New(pRVar13,iVar19,(pMVar16->super_Opnd).m_type,this_01->m_func,
                                       false);
          InsertMove(&pIVar12->super_Opnd,&pMVar16->super_Opnd,(Instr *)instr,true);
          uVar18 = uVar18 + 1;
          iVar19 = iVar19 + 8;
        } while (uVar18 < uStack_50);
      }
    }
  }
  InsertBranch(Br,false,unaff_RBX,(Instr *)instr);
  IR::Instr::InsertBefore((Instr *)instr,&helperLabel->super_Instr);
  uVar17 = (undefined7)((ulong)extraout_RAX >> 8);
LAB_005c341c:
  return (Opnd *)(CONCAT71(uVar17,bVar4) ^ 1);
}

Assistant:

IR::Opnd*
Lowerer::GetMissingItemOpndForAssignment(IRType type, Func *func)
{
    switch (type)
    {
    case TyVar:
    case TyInt32:
        return GetMissingItemOpnd(type, func);

    case TyFloat64:
        return IR::MemRefOpnd::New(func->GetThreadContextInfo()->GetNativeFloatArrayMissingItemAddr(), TyFloat64, func);

    default:
        AnalysisAssertMsg(false, "Unexpected type in Lowerer::GetMissingItemOpndForAssignment");
        __assume(false);
    }
}